

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_aarch64.c
# Opt level: O0

uc_err reg_read_aarch64(void *_env,int mode,uint regid,void *value,size_t *size)

{
  uint32_t uVar1;
  uint32_t reg_index;
  float64 *dst;
  uc_err ret;
  CPUARMState_conflict *env;
  size_t *size_local;
  void *value_local;
  uint regid_local;
  int mode_local;
  void *_env_local;
  
  dst._4_4_ = UC_ERR_ARG;
  value_local._0_4_ = regid;
  if ((0xe3 < regid) && (regid < 0x104)) {
    value_local._0_4_ = regid - 0x7c;
  }
  if (((uint)value_local < 199) || (0xe3 < (uint)value_local)) {
    if (((uint)value_local < 0xa8) || (0xc6 < (uint)value_local)) {
      if (((uint)value_local < 0x68) || (0x87 < (uint)value_local)) {
        if (((uint)value_local < 0x28) || (0x47 < (uint)value_local)) {
          if (((uint)value_local < 0x88) || (0xa7 < (uint)value_local)) {
            if (((uint)value_local < 0x48) || (0x67 < (uint)value_local)) {
              if (((uint)value_local < 8) || (0x27 < (uint)value_local)) {
                if (((uint)value_local < 0x10a) || (0x10d < (uint)value_local)) {
                  if (((uint)value_local < 0x10e) || (0x111 < (uint)value_local)) {
                    if (((uint)value_local < 0x114) || (0x117 < (uint)value_local)) {
                      if (((uint)value_local < 0x118) || (0x11b < (uint)value_local)) {
                        if (((uint)value_local < 0x11e) || (0x121 < (uint)value_local)) {
                          if ((uint)value_local == 1) {
                            if (*size < 8) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 8;
                            dst._4_4_ = UC_ERR_OK;
                            *(undefined8 *)value = *(undefined8 *)((long)_env + 0x128);
                          }
                          else if ((uint)value_local == 2) {
                            if (*size < 8) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 8;
                            dst._4_4_ = UC_ERR_OK;
                            *(undefined8 *)value = *(undefined8 *)((long)_env + 0x130);
                          }
                          else if ((uint)value_local == 3) {
                            if (*size < 4) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 4;
                            dst._4_4_ = UC_ERR_OK;
                            uVar1 = cpsr_read_aarch64((CPUARMState_conflict *)_env);
                            *(uint32_t *)value = uVar1 & 0xf0000000;
                          }
                          else if ((uint)value_local == 4) {
                            if (*size < 8) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 8;
                            dst._4_4_ = UC_ERR_OK;
                            *(undefined8 *)value = *(undefined8 *)((long)_env + 0x138);
                          }
                          else if ((uint)value_local == 0x104) {
                            if (*size < 8) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 8;
                            dst._4_4_ = UC_ERR_OK;
                            *(undefined8 *)value = *(undefined8 *)((long)_env + 0x140);
                          }
                          else if ((uint)value_local == 0x105) {
                            if (*size < 4) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 4;
                            dst._4_4_ = UC_ERR_OK;
                            *(int *)value = (int)*(undefined8 *)((long)_env + 0x2c0);
                          }
                          else if ((uint)value_local == 0x106) {
                            if (*size < 8) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 8;
                            dst._4_4_ = UC_ERR_OK;
                            *(undefined8 *)value = *(undefined8 *)((long)_env + 0x510);
                          }
                          else if ((uint)value_local == 0x107) {
                            if (*size < 8) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 8;
                            dst._4_4_ = UC_ERR_OK;
                            *(undefined8 *)value = *(undefined8 *)((long)_env + 0x548);
                          }
                          else if ((uint)value_local == 0x108) {
                            if (*size < 8) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 8;
                            dst._4_4_ = UC_ERR_OK;
                            *(undefined8 *)value = *(undefined8 *)((long)_env + 0x518);
                          }
                          else if ((uint)value_local == 0x109) {
                            if (*size < 4) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 4;
                            dst._4_4_ = UC_ERR_OK;
                            uVar1 = pstate_read((CPUARMState_conflict *)_env);
                            *(uint32_t *)value = uVar1;
                          }
                          else if ((uint)value_local == 0x112) {
                            if (*size < 8) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 8;
                            dst._4_4_ = UC_ERR_OK;
                            *(undefined8 *)value = *(undefined8 *)((long)_env + 0x308);
                          }
                          else if ((uint)value_local == 0x113) {
                            if (*size < 8) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 8;
                            dst._4_4_ = UC_ERR_OK;
                            *(undefined8 *)value = *(undefined8 *)((long)_env + 0x328);
                          }
                          else if ((uint)value_local == 0x11c) {
                            if (*size < 8) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 8;
                            dst._4_4_ = UC_ERR_OK;
                            *(undefined8 *)value = *(undefined8 *)((long)_env + 0x450);
                          }
                          else if ((uint)value_local == 0x11d) {
                            if (*size < 8) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 8;
                            dst._4_4_ = UC_ERR_OK;
                            *(undefined8 *)value = *(undefined8 *)((long)_env + 0x4a8);
                          }
                          else if ((uint)value_local == 0x122) {
                            if (*size < 0x20) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 0x20;
                            dst._4_4_ = read_cp_reg((CPUARMState_conflict *)_env,
                                                    (uc_arm64_cp_reg *)value);
                          }
                          else if ((uint)value_local == 0x123) {
                            if (*size < 4) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 4;
                            dst._4_4_ = UC_ERR_OK;
                            uVar1 = vfp_get_fpcr((CPUARMState_conflict *)_env);
                            *(uint32_t *)value = uVar1;
                          }
                          else if ((uint)value_local == 0x124) {
                            if (*size < 4) {
                              return UC_ERR_OVERFLOW;
                            }
                            *size = 4;
                            dst._4_4_ = UC_ERR_OK;
                            uVar1 = vfp_get_fpsr((CPUARMState_conflict *)_env);
                            *(uint32_t *)value = uVar1;
                          }
                        }
                        else {
                          if (*size < 8) {
                            return UC_ERR_OVERFLOW;
                          }
                          *size = 8;
                          dst._4_4_ = UC_ERR_OK;
                          *(undefined8 *)value =
                               *(undefined8 *)
                                ((long)_env + (ulong)((uint)value_local - 0x11e) * 8 + 0x4c0);
                        }
                      }
                      else {
                        if (*size < 8) {
                          return UC_ERR_OVERFLOW;
                        }
                        *size = 8;
                        dst._4_4_ = UC_ERR_OK;
                        *(undefined8 *)value =
                             *(undefined8 *)
                              ((long)_env + (ulong)((uint)value_local - 0x118) * 8 + 0x418);
                      }
                    }
                    else {
                      if (*size < 8) {
                        return UC_ERR_OVERFLOW;
                      }
                      *size = 8;
                      dst._4_4_ = UC_ERR_OK;
                      *(undefined8 *)value =
                           *(undefined8 *)
                            ((long)_env + (ulong)((uint)value_local - 0x114) * 8 + 0x3d8);
                    }
                  }
                  else {
                    if (*size < 8) {
                      return UC_ERR_OVERFLOW;
                    }
                    *size = 8;
                    dst._4_4_ = UC_ERR_OK;
                    *(undefined8 *)value =
                         *(undefined8 *)((long)_env + (ulong)((uint)value_local - 0x10e) * 8 + 600);
                  }
                }
                else {
                  if (*size < 8) {
                    return UC_ERR_OVERFLOW;
                  }
                  *size = 8;
                  dst._4_4_ = UC_ERR_OK;
                  *(undefined8 *)value =
                       *(undefined8 *)((long)_env + (ulong)((uint)value_local - 0x10a) * 8 + 0x238);
                }
              }
              else {
                if (*size == 0) {
                  return UC_ERR_OVERFLOW;
                }
                *size = 1;
                dst._4_4_ = UC_ERR_OK;
                *(char *)value =
                     (char)*(undefined8 *)
                            ((long)_env + (ulong)((uint)value_local - 8) * 0x100 + 0xc10);
              }
            }
            else {
              if (*size < 2) {
                return UC_ERR_OVERFLOW;
              }
              *size = 2;
              dst._4_4_ = UC_ERR_OK;
              *(short *)value =
                   (short)*(undefined8 *)
                           ((long)_env + (ulong)((uint)value_local - 0x48) * 0x100 + 0xc10);
            }
          }
          else {
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            dst._4_4_ = UC_ERR_OK;
            *(int *)value =
                 (int)*(undefined8 *)
                       ((long)_env + (ulong)((uint)value_local - 0x88) * 0x100 + 0xc10);
          }
        }
        else {
          if (*size < 8) {
            return UC_ERR_OVERFLOW;
          }
          *size = 8;
          dst._4_4_ = UC_ERR_OK;
          *(undefined8 *)value =
               *(undefined8 *)((long)_env + (ulong)((uint)value_local - 0x28) * 0x100 + 0xc10);
        }
      }
      else {
        if (*size < 0x10) {
          return UC_ERR_OVERFLOW;
        }
        *size = 0x10;
        dst._4_4_ = UC_ERR_OK;
        *(undefined8 *)value =
             *(undefined8 *)((long)_env + (ulong)((uint)value_local - 0x68) * 0x100 + 0xc10);
        *(undefined8 *)((long)value + 8) =
             *(undefined8 *)((long)_env + (ulong)((uint)value_local - 0x68) * 0x100 + 0xc18);
      }
    }
    else {
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      dst._4_4_ = UC_ERR_OK;
      *(int *)value =
           (int)*(undefined8 *)((long)_env + (ulong)((uint)value_local - 0xa8) * 8 + 0x40);
    }
  }
  else {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    dst._4_4_ = UC_ERR_OK;
    *(undefined8 *)value = *(undefined8 *)((long)_env + (ulong)((uint)value_local - 199) * 8 + 0x40)
    ;
  }
  return dst._4_4_;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_read(void *_env, int mode, unsigned int regid, void *value,
                size_t *size)
{
    CPUARMState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_ARM64_REG_V0 && regid <= UC_ARM64_REG_V31) {
        regid += UC_ARM64_REG_Q0 - UC_ARM64_REG_V0;
    }
    if (regid >= UC_ARM64_REG_X0 && regid <= UC_ARM64_REG_X28) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->xregs[regid - UC_ARM64_REG_X0];
    } else if (regid >= UC_ARM64_REG_W0 && regid <= UC_ARM64_REG_W30) {
        CHECK_REG_TYPE(uint32_t);
        *(uint32_t *)value = READ_DWORD(env->xregs[regid - UC_ARM64_REG_W0]);
    } else if (regid >= UC_ARM64_REG_Q0 && regid <= UC_ARM64_REG_Q31) { // FIXME
        CHECK_REG_TYPE(float64[2]);
        float64 *dst = (float64 *)value;
        uint32_t reg_index = regid - UC_ARM64_REG_Q0;
        dst[0] = env->vfp.zregs[reg_index].d[0];
        dst[1] = env->vfp.zregs[reg_index].d[1];
    } else if (regid >= UC_ARM64_REG_D0 && regid <= UC_ARM64_REG_D31) {
        CHECK_REG_TYPE(float64);
        *(float64 *)value = env->vfp.zregs[regid - UC_ARM64_REG_D0].d[0];
    } else if (regid >= UC_ARM64_REG_S0 && regid <= UC_ARM64_REG_S31) {
        CHECK_REG_TYPE(int32_t);
        *(int32_t *)value =
            READ_DWORD(env->vfp.zregs[regid - UC_ARM64_REG_S0].d[0]);
    } else if (regid >= UC_ARM64_REG_H0 && regid <= UC_ARM64_REG_H31) {
        CHECK_REG_TYPE(int16_t);
        *(int16_t *)value =
            READ_WORD(env->vfp.zregs[regid - UC_ARM64_REG_H0].d[0]);
    } else if (regid >= UC_ARM64_REG_B0 && regid <= UC_ARM64_REG_B31) {
        CHECK_REG_TYPE(int8_t);
        *(int8_t *)value =
            READ_BYTE_L(env->vfp.zregs[regid - UC_ARM64_REG_B0].d[0]);
    } else if (regid >= UC_ARM64_REG_ELR_EL0 && regid <= UC_ARM64_REG_ELR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->elr_el[regid - UC_ARM64_REG_ELR_EL0];
    } else if (regid >= UC_ARM64_REG_SP_EL0 && regid <= UC_ARM64_REG_SP_EL3) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->sp_el[regid - UC_ARM64_REG_SP_EL0];
    } else if (regid >= UC_ARM64_REG_ESR_EL0 && regid <= UC_ARM64_REG_ESR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->cp15.esr_el[regid - UC_ARM64_REG_ESR_EL0];
    } else if (regid >= UC_ARM64_REG_FAR_EL0 && regid <= UC_ARM64_REG_FAR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->cp15.far_el[regid - UC_ARM64_REG_FAR_EL0];
    } else if (regid >= UC_ARM64_REG_VBAR_EL0 &&
               regid <= UC_ARM64_REG_VBAR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->cp15.vbar_el[regid - UC_ARM64_REG_VBAR_EL0];
    } else {
        switch (regid) {
        default:
            break;
        case UC_ARM64_REG_CPACR_EL1:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = env->cp15.cpacr_el1;
            break;
        case UC_ARM64_REG_TPIDR_EL0:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->cp15.tpidr_el[0];
            break;
        case UC_ARM64_REG_TPIDRRO_EL0:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->cp15.tpidrro_el[0];
            break;
        case UC_ARM64_REG_TPIDR_EL1:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->cp15.tpidr_el[1];
            break;
        case UC_ARM64_REG_X29:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->xregs[29];
            break;
        case UC_ARM64_REG_X30:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->xregs[30];
            break;
        case UC_ARM64_REG_PC:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->pc;
            break;
        case UC_ARM64_REG_SP:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->xregs[31];
            break;
        case UC_ARM64_REG_NZCV:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = cpsr_read(env) & CPSR_NZCV;
            break;
        case UC_ARM64_REG_PSTATE:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = pstate_read(env);
            break;
        case UC_ARM64_REG_TTBR0_EL1:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->cp15.ttbr0_el[1];
            break;
        case UC_ARM64_REG_TTBR1_EL1:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->cp15.ttbr1_el[1];
            break;
        case UC_ARM64_REG_PAR_EL1:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->cp15.par_el[1];
            break;
        case UC_ARM64_REG_MAIR_EL1:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->cp15.mair_el[1];
            break;
        case UC_ARM64_REG_CP_REG:
            CHECK_REG_TYPE(uc_arm64_cp_reg);
            ret = read_cp_reg(env, (uc_arm64_cp_reg *)value);
            break;
        case UC_ARM64_REG_FPCR:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = vfp_get_fpcr(env);
            break;
        case UC_ARM64_REG_FPSR:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = vfp_get_fpsr(env);
            break;
        }
    }

    return ret;
}